

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combine_tests.cpp
# Opt level: O2

void __thiscall iu_CombineTest_x_iutest_x_Num_Test::Body(iu_CombineTest_x_iutest_x_Num_Test *this)

{
  TestSuite *pTVar1;
  int *in_R9;
  iuCodeMessage local_1f0;
  AssertionResult iutest_ar;
  Fixed local_198;
  
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 0x10;
  pTVar1 = iuutil::GetCurrentTestSuite();
  local_1f0.m_message._M_dataplus._M_p._0_4_ =
       (undefined4)
       ((ulong)((long)(pTVar1->m_testinfos).
                      super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(pTVar1->m_testinfos).
                     super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>.
                     _M_impl.super__Vector_impl_data._M_start) >> 3);
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)"(2*2*TABLE_SIZE) * 2",
             "::iuutil::GetCurrentTestSuite()->total_test_count()",(char *)&local_198,
             (int *)&local_1f0,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/combine_tests.cpp"
               ,0x33,iutest_ar.m_message._M_dataplus._M_p);
    local_1f0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST_P(CombineTest, Num)
{
    IUTEST_EXPECT_EQ( (2*2*TABLE_SIZE) * 2, ::iuutil::GetCurrentTestSuite()->total_test_count() );
}